

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

void __thiscall
ImageTypeManager::setConvertFunction(ImageTypeManager *this,CopyForm1 Copy,Image *in,Image *out)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  undefined8 uVar7;
  mapped_type *pp_Var8;
  mapped_type *pmVar9;
  imageException *this_00;
  uint8_t local_49;
  ImageTemplate<unsigned_char> local_48;
  
  if (in->_type != out->_type) {
    local_48._vptr_ImageTemplate._0_2_ = CONCAT11(out->_type,in->_type);
    pp_Var8 = std::
              map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
              ::operator[](&this->_intertypeConvertMap,(key_type *)&local_48);
    *pp_Var8 = (mapped_type)Copy;
    PenguinV_Image::ImageTemplate<unsigned_char>::generate(&local_48,in,0,0,'\x01','\x01');
    local_49 = in->_type;
    pmVar9 = std::
             map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
             ::operator[](&this->_image,&local_49);
    uVar5._0_4_ = pmVar9->_width;
    uVar5._4_4_ = pmVar9->_height;
    pmVar9->_width = local_48._width;
    pmVar9->_height = local_48._height;
    uVar1 = pmVar9->_colorCount;
    pmVar9->_colorCount = local_48._colorCount;
    uVar4 = pmVar9->_rowSize;
    pmVar9->_rowSize = local_48._rowSize;
    uVar2 = pmVar9->_alignment;
    pmVar9->_alignment = local_48._alignment;
    puVar6 = pmVar9->_data;
    pmVar9->_data = local_48._data;
    uVar3 = pmVar9->_type;
    pmVar9->_type = local_48._type;
    local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
    local_48._8_8_ = uVar5;
    local_48._colorCount = uVar1;
    local_48._alignment = uVar2;
    local_48._rowSize = uVar4;
    local_48._data = puVar6;
    local_48._type = uVar3;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
    PenguinV_Image::ImageTemplate<unsigned_char>::generate(&local_48,out,0,0,'\x01','\x01');
    local_49 = out->_type;
    pmVar9 = std::
             map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
             ::operator[](&this->_image,&local_49);
    uVar7._0_4_ = pmVar9->_width;
    uVar7._4_4_ = pmVar9->_height;
    pmVar9->_width = local_48._width;
    pmVar9->_height = local_48._height;
    uVar1 = pmVar9->_colorCount;
    pmVar9->_colorCount = local_48._colorCount;
    uVar4 = pmVar9->_rowSize;
    pmVar9->_rowSize = local_48._rowSize;
    uVar2 = pmVar9->_alignment;
    pmVar9->_alignment = local_48._alignment;
    puVar6 = pmVar9->_data;
    pmVar9->_data = local_48._data;
    uVar3 = pmVar9->_type;
    pmVar9->_type = local_48._type;
    local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
    local_48._8_8_ = uVar7;
    local_48._colorCount = uVar1;
    local_48._alignment = uVar2;
    local_48._rowSize = uVar4;
    local_48._data = puVar6;
    local_48._type = uVar3;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Cannot register same type images for intertype copy");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ImageTypeManager::setConvertFunction( Image_Function_Helper::FunctionTable::CopyForm1 Copy, const PenguinV_Image::Image & in, const PenguinV_Image::Image & out )
{
    if ( in.type() == out.type() )
        throw imageException( "Cannot register same type images for intertype copy" );

    _intertypeConvertMap[std::pair<uint8_t, uint8_t>( in.type(), out.type() )] = Copy;

    _image[in.type()] = in.generate();
    _image[out.type()] = out.generate();
}